

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration_x11.cpp
# Opt level: O1

bool __thiscall
QOffscreenX11GLXContext::makeCurrent(QOffscreenX11GLXContext *this,QPlatformSurface *surface)

{
  QOffscreenX11GLXContextData *pQVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  
  plVar3 = (long *)QPlatformSurface::surface();
  uVar4 = (**(code **)(*plVar3 + 0x28))(plVar3);
  pQVar1 = (this->d).d;
  XResizeWindow(pQVar1->x11->m_connection->m_display,pQVar1->window,uVar4 & 0xffffffff,uVar4 >> 0x20
               );
  XSync(((this->d).d)->x11->m_connection->m_display,1);
  pQVar1 = (this->d).d;
  iVar2 = glXMakeCurrent(pQVar1->x11->m_connection->m_display,pQVar1->window,pQVar1->context);
  if (iVar2 != 0) {
    glViewport(0,0,uVar4 & 0xffffffff,uVar4 >> 0x20);
  }
  return iVar2 != 0;
}

Assistant:

bool QOffscreenX11GLXContext::makeCurrent(QPlatformSurface *surface)
{
    QSize size = surface->surface()->size();

    XResizeWindow(d->x11->display(), d->window, size.width(), size.height());
    XSync(d->x11->display(), true);

    if (glXMakeCurrent(d->x11->display(), d->window, d->context)) {
        glViewport(0, 0, size.width(), size.height());
        return true;
    }

    return false;
}